

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

char * __thiscall format_iter::next(format_iter *this,size_t *len)

{
  vm_val_t *this_00;
  int iVar1;
  size_t sVar2;
  ushort *puVar3;
  size_t sVar4;
  vm_val_t ele;
  vm_val_t local_28;
  
  *len = 0;
  if (this->mode != 0) goto LAB_0027f016;
  while( true ) {
    if (this->custom_cnt <= this->cidx) {
      return (char *)0x0;
    }
    iVar1 = vm_val_t::is_listlike(this->custom);
    this_00 = this->custom;
    if (iVar1 == 0) break;
    sVar4 = this->cidx + 1;
    this->cidx = sVar4;
    vm_val_t::ll_index(this_00,&local_28,(int)sVar4);
    if (local_28.typ != VM_NIL) goto LAB_0027f053;
    this->mode = 1;
LAB_0027f016:
    if (this->bidx < this->builtin_cnt) {
      sVar2 = strlen(this->builtin[this->bidx]);
      *len = sVar2;
      sVar4 = this->bidx;
      this->bidx = sVar4 + 1;
      return this->builtin[sVar4];
    }
    this->mode = 0;
  }
  local_28.typ = this_00->typ;
  local_28._4_4_ = *(undefined4 *)&this_00->field_0x4;
  local_28.val = this_00->val;
LAB_0027f053:
  puVar3 = (ushort *)vm_val_t::get_as_string(&local_28);
  if (puVar3 == (ushort *)0x0) {
    return (char *)0x0;
  }
  *len = (ulong)*puVar3;
  return (char *)(puVar3 + 1);
}

Assistant:

const char *next(VMG_ size_t &len)
    {
        /* assume we won't find anythign */
        len = 0;

        /* keep going until we find something */
        for (;;)
        {
            if (mode == 0)
            {
                /* custom list - if exhausted, we're done */
                if (cidx >= custom_cnt)
                    return 0;

                /* get the next custom item, according to the source type */
                vm_val_t ele;
                if (custom->is_listlike(vmg0_))
                {
                    /* get the next list element */
                    custom->ll_index(vmg_ &ele, ++cidx);

                    /* if it's nil, switch to the builtin list */
                    if (ele.typ == VM_NIL)
                    {
                        mode = 1;
                        continue;
                    }
                }
                else
                {
                    /* it must be a single string */
                    ele = *custom;
                }

                /* retrieve the string value */
                const char *str = ele.get_as_string(vmg0_);
                if (str != 0)
                {
                    len = vmb_get_len(str);
                    str += VMB_LEN;
                }
                return str;
            }
            else
            {
                /* builtin list - if exhausted, return to the custom list */
                if (bidx >= builtin_cnt)
                {
                    mode = 0;
                    continue;
                }

                /* return the next builtin item */
                len = strlen(builtin[bidx]);
                return builtin[bidx++];
            }
        }
    }